

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LlvmModule * CompileLlvm(ExpressionContext *exprCtx,ExprModule *expression)

{
  uint uVar1;
  TypeBase **ppTVar2;
  FunctionData *pFVar3;
  VariableData *pVVar4;
  char *__src;
  ExprModule *pEVar5;
  bool bVar6;
  int iVar7;
  ScopeData *pSVar8;
  undefined4 extraout_var;
  LLVMValueRefOpaque **ppLVar9;
  LlvmModule *pLVar10;
  undefined4 extraout_var_01;
  ulong uVar11;
  ulong uVar12;
  ExprBase *pEVar13;
  ArrayView<TypeBase_*> argumentTypes;
  ArrayView<TypeBase_*> argumentTypes_00;
  ArrayView<TypeBase_*> argumentTypes_01;
  ArrayView<TypeBase_*> argumentTypes_02;
  ArrayView<TypeBase_*> argumentTypes_03;
  ArrayView<TypeBase_*> argumentTypes_04;
  ArrayView<TypeBase_*> argumentTypes_05;
  ArrayView<TypeBase_*> argumentTypes_06;
  TypeBase *arguments [2];
  TraceScope traceScope;
  TypeStruct *local_13b8;
  TypeStruct *local_13b0;
  TypeBase *local_13a8;
  ExprModule *local_1398;
  TraceScope local_1390;
  LlvmCompilationContext local_1380;
  undefined4 extraout_var_00;
  
  if (CompileLlvm(ExpressionContext&,ExprModule*)::token == '\0') {
    iVar7 = __cxa_guard_acquire(&CompileLlvm(ExpressionContext&,ExprModule*)::token);
    if (iVar7 != 0) {
      CompileLlvm::token = NULLC::TraceGetToken("InstructionTreeLlvm","CompileLlvm");
      __cxa_guard_release(&CompileLlvm(ExpressionContext&,ExprModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_1390,CompileLlvm::token);
  LlvmCompilationContext::LlvmCompilationContext(&local_1380,exprCtx);
  local_1380.builder = (LLVMBuilderRef)0x0;
  local_1380.functionPassManager = (LLVMPassManagerRef)0x0;
  local_1380.context = (LLVMContextRef)0x0;
  local_1380.module = (LLVMModuleRef)0x0;
  local_1380.types.count = ((local_1380.ctx)->types).count;
  uVar12 = (ulong)local_1380.types.count;
  if (uVar12 != 0) {
    ppTVar2 = ((local_1380.ctx)->types).data;
    uVar11 = 0;
    do {
      ppTVar2[uVar11]->typeIndex = (uint)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  if (local_1380.types.max <= local_1380.types.count) {
    SmallArray<LLVMTypeRefOpaque_*,_128U>::grow(&local_1380.types,local_1380.types.count);
  }
  memset(local_1380.types.data,0,uVar12 << 3);
  local_1380.functions.count = ((local_1380.ctx)->functions).count;
  if (local_1380.functions.max <= local_1380.functions.count) {
    SmallArray<LLVMValueRefOpaque_*,_128U>::grow(&local_1380.functions,local_1380.functions.count);
  }
  memset(local_1380.functions.data,0,(ulong)local_1380.functions.count * 8);
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,(ArrayView<TypeBase_*>)ZEXT816(0));
  local_13b8 = (local_1380.ctx)->typeAutoRef;
  local_13b0 = (TypeStruct *)(local_1380.ctx)->typeTypeID;
  argumentTypes._8_8_ = 2;
  argumentTypes.data = (TypeBase **)&local_13b8;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeNullPtr,argumentTypes);
  local_13b8 = (TypeStruct *)(local_1380.ctx)->typeInt;
  argumentTypes_00._8_8_ = 2;
  argumentTypes_00.data = (TypeBase **)&local_13b8;
  local_13b0 = local_13b8;
  CompileLlvmFunctionType(&local_1380,(TypeBase *)local_13b8,argumentTypes_00);
  local_13b8 = (TypeStruct *)(local_1380.ctx)->typeLong;
  argumentTypes_01._8_8_ = 2;
  argumentTypes_01.data = (TypeBase **)&local_13b8;
  local_13b0 = local_13b8;
  CompileLlvmFunctionType(&local_1380,(TypeBase *)local_13b8,argumentTypes_01);
  local_13b8 = (TypeStruct *)(local_1380.ctx)->typeDouble;
  argumentTypes_02._8_8_ = 2;
  argumentTypes_02.data = (TypeBase **)&local_13b8;
  local_13b0 = local_13b8;
  CompileLlvmFunctionType(&local_1380,(TypeBase *)local_13b8,argumentTypes_02);
  local_13b8 = (TypeStruct *)(local_1380.ctx)->typeInt;
  argumentTypes_03._8_8_ = 1;
  argumentTypes_03.data = (TypeBase **)&local_13b8;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_03);
  local_13b8 = (TypeStruct *)(local_1380.ctx)->typeLong;
  argumentTypes_04._8_8_ = 1;
  argumentTypes_04.data = (TypeBase **)&local_13b8;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_04);
  local_13b8 = (TypeStruct *)(local_1380.ctx)->typeDouble;
  argumentTypes_05._8_8_ = 1;
  argumentTypes_05.data = (TypeBase **)&local_13b8;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_05);
  local_13b8 = (TypeStruct *)(local_1380.ctx)->typeInt;
  local_13b0 = (TypeStruct *)(local_1380.ctx)->typeNullPtr;
  argumentTypes_06._8_8_ = 3;
  argumentTypes_06.data = (TypeBase **)&local_13b8;
  local_13a8 = (TypeBase *)local_13b0;
  CompileLlvmFunctionType(&local_1380,(local_1380.ctx)->typeVoid,argumentTypes_06);
  local_1398 = expression;
  if (((local_1380.ctx)->functions).count != 0) {
    uVar12 = 0;
    do {
      pFVar3 = ((local_1380.ctx)->functions).data[uVar12];
      bVar6 = ExpressionContext::IsGenericFunction(local_1380.ctx,pFVar3);
      if ((!bVar6) &&
         ((pFVar3->isPrototype != true || (pFVar3->implementation == (FunctionData *)0x0)))) {
        if (local_1380.functions.count <= pFVar3->functionIndex) goto LAB_001883a5;
        if (local_1380.functions.data[pFVar3->functionIndex] == (LLVMValueRefOpaque *)0x0) {
          CreateLlvmFunctionName(&local_1380,pFVar3);
          CompileLlvmFunctionType(&local_1380,pFVar3->type);
          if (local_1380.functions.count <= pFVar3->functionIndex) goto LAB_001883a5;
          local_1380.functions.data[pFVar3->functionIndex] = (LLVMValueRefOpaque *)&placeholderValue
          ;
          if ((pFVar3->importModule == (ModuleData *)0x0) && (pFVar3->isPrototype == true)) {
            CompileLlvmExternalFunctionWrapper(&local_1380,pFVar3);
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < ((local_1380.ctx)->functions).count);
  }
  if (((local_1380.ctx)->functions).count != 0) {
    uVar12 = 0;
    do {
      pFVar3 = ((local_1380.ctx)->functions).data[uVar12];
      if ((pFVar3->isPrototype == true) && (pFVar3->implementation != (FunctionData *)0x0)) {
        uVar1 = pFVar3->implementation->functionIndex;
        if ((local_1380.functions.count <= uVar1) ||
           (local_1380.functions.count <= pFVar3->functionIndex)) {
LAB_001883a5:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<LLVMValueRefOpaque *, 128>::operator[](unsigned int) [T = LLVMValueRefOpaque *, N = 128]"
                       );
        }
        local_1380.functions.data[pFVar3->functionIndex] = local_1380.functions.data[uVar1];
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < ((local_1380.ctx)->functions).count);
  }
  if (((local_1380.ctx)->variables).count != 0) {
    uVar12 = 0;
    do {
      pVVar4 = ((local_1380.ctx)->variables).data[uVar12];
      pSVar8 = ExpressionContext::GlobalScopeFrom(local_1380.ctx,pVVar4->scope);
      if (pSVar8 != (ScopeData *)0x0) {
        CompileLlvmType(&local_1380,pVVar4->type);
        __src = (pVVar4->name->name).begin;
        uVar11 = (long)(pVVar4->name->name).end - (long)__src;
        iVar7 = (*(local_1380.allocator)->_vptr_Allocator[2])
                          (local_1380.allocator,(ulong)((int)uVar11 + 1));
        uVar11 = uVar11 & 0xffffffff;
        memcpy((void *)CONCAT44(extraout_var,iVar7),__src,uVar11);
        *(undefined1 *)((long)CONCAT44(extraout_var,iVar7) + uVar11) = 0;
        local_13b8 = (TypeStruct *)&placeholderValue;
        if (pVVar4->importModule == (ModuleData *)0x0) {
          CompileLlvmType(&local_1380,pVVar4->type);
        }
        ppLVar9 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                  ::find(&local_1380.variables,&pVVar4->uniqueId);
        if (ppLVar9 != (LLVMValueRefOpaque **)0x0) {
          __assert_fail("!ctx.variables.find(variable->uniqueId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                        ,0xa25,"LlvmModule *CompileLlvm(ExpressionContext &, ExprModule *)");
        }
        SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                  (&local_1380.variables,&pVVar4->uniqueId,(LLVMValueRefOpaque **)&local_13b8);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < ((local_1380.ctx)->variables).count);
  }
  pEVar5 = local_1398;
  if ((local_1398->definitions).count != 0) {
    uVar12 = 0;
    do {
      CompileLlvm(&local_1380,(pEVar5->definitions).data[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (pEVar5->definitions).count);
  }
  local_1380.skipFunctionDefinitions = true;
  local_1380.currentFunction = (LLVMValueRef)&placeholderValue;
  local_1380.currentFunctionGlobal = true;
  pEVar13 = (pEVar5->setup).head;
  if (pEVar13 != (ExprBase *)0x0) {
    do {
      CompileLlvm(&local_1380,pEVar13);
      pEVar13 = pEVar13->next;
    } while (pEVar13 != (ExprBase *)0x0);
  }
  pEVar13 = (pEVar5->expressions).head;
  if (pEVar13 != (ExprBase *)0x0) {
    do {
      CompileLlvm(&local_1380,pEVar13);
      pEVar13 = pEVar13->next;
    } while (pEVar13 != (ExprBase *)0x0);
  }
  local_1380.currentFunction = (LLVMValueRef)0x0;
  local_1380.currentFunctionGlobal = false;
  iVar7 = (*(local_1380.allocator)->_vptr_Allocator[2])(local_1380.allocator,0x10);
  pLVar10 = (LlvmModule *)CONCAT44(extraout_var_00,iVar7);
  pLVar10->moduleData = (char *)0x0;
  pLVar10->moduleSize = 0;
  iVar7 = (*(local_1380.allocator)->_vptr_Allocator[2])(local_1380.allocator,0);
  pLVar10->moduleData = (char *)CONCAT44(extraout_var_01,iVar7);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::~SmallArray(&local_1380.loopInfo);
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray(&local_1380.currentRestoreBlocks);
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
  ~SmallDenseMap(&local_1380.variables);
  SmallArray<LLVMValueRefOpaque_*,_128U>::~SmallArray(&local_1380.functions);
  SmallArray<LLVMTypeRefOpaque_*,_128U>::~SmallArray(&local_1380.types);
  NULLC::TraceScope::~TraceScope(&local_1390);
  return pLVar10;
}

Assistant:

LlvmModule* CompileLlvm(ExpressionContext &exprCtx, ExprModule *expression)
{
	TRACE_SCOPE("InstructionTreeLlvm", "CompileLlvm");

	LlvmCompilationContext ctx(exprCtx);

	ctx.context = LLVMContextCreate();

	ctx.module = LLVMModuleCreateWithNameInContext("module", ctx.context);

	ctx.builder = LLVMCreateBuilderInContext(ctx.context);

	ctx.functionPassManager = LLVMCreateFunctionPassManagerForModule(ctx.module);

	LLVMAddBasicAliasAnalysisPass(ctx.functionPassManager);

	if(ctx.enableOptimization)
	{
		LLVMAddScalarReplAggregatesPass(ctx.functionPassManager);
		LLVMAddInstructionCombiningPass(ctx.functionPassManager);
		LLVMAddEarlyCSEPass(ctx.functionPassManager);
		LLVMAddReassociatePass(ctx.functionPassManager);
		LLVMAddGVNPass(ctx.functionPassManager);
		LLVMAddConstantPropagationPass(ctx.functionPassManager);
	}

	LLVMAddCFGSimplificationPass(ctx.functionPassManager);
	LLVMAddAggressiveDCEPass(ctx.functionPassManager);

	LLVMInitializeFunctionPassManager(ctx.functionPassManager);

	// Generate type indexes
	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
		ctx.ctx.types[i]->typeIndex = i;

	// Reserve types, generate as required
	ctx.types.resize(ctx.ctx.types.size());
	memset(ctx.types.data, 0, ctx.types.count * sizeof(ctx.types[0]));

	// Reserve functions
	ctx.functions.resize(ctx.ctx.functions.size());
	memset(ctx.functions.data, 0, ctx.functions.count * sizeof(ctx.functions[0]));

	// Create runtime support functions
	{
		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmAbortNoReturn", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, ArrayView<TypeBase*>()));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeAutoRef, ctx.ctx.typeTypeID };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmConvertPtr", CompileLlvmFunctionType(ctx, ctx.ctx.typeNullPtr, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt, ctx.ctx.typeInt };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowInt", CompileLlvmFunctionType(ctx, ctx.ctx.typeInt, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeLong, ctx.ctx.typeLong };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowLong", CompileLlvmFunctionType(ctx, ctx.ctx.typeLong, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeDouble, ctx.ctx.typeDouble };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmPowDouble", CompileLlvmFunctionType(ctx, ctx.ctx.typeDouble, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnInt", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeLong };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnLong", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeDouble };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmReturnDouble", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	{
		TypeBase* arguments[] = { ctx.ctx.typeInt, ctx.ctx.typeNullPtr, ctx.ctx.typeNullPtr };

		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmExternalCall", CompileLlvmFunctionType(ctx, ctx.ctx.typeVoid, arguments));
		LLVMSetLinkage(function, LLVMExternalLinkage);
	}

	// Generate functions
	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
			continue;

		// Skip prototypes that will have an implementation later
		if(function->isPrototype && function->implementation)
			continue;

		// Skip if function is already ready
		if(ctx.functions[function->functionIndex])
			continue;

		LLVMValueRef llvmFunction = LLVMAddFunction(ctx.module, CreateLlvmFunctionName(ctx, function), CompileLlvmFunctionType(ctx, function->type));

		if(IsStructReturnType(function->type->returnType))
		{
			LLVMAddAttributeAtIndex(llvmFunction, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("nonnull", unsigned(strlen("nonnull"))), 0));
			LLVMAddAttributeAtIndex(llvmFunction, 1, LLVMCreateEnumAttribute(ctx.context, LLVMGetEnumAttributeKindForName("sret", unsigned(strlen("sret"))), 0));
		}

		ctx.functions[function->functionIndex] = llvmFunction;

		// Create an external function call wrapper
		if(function->importModule == NULL && function->isPrototype)
			CompileLlvmExternalFunctionWrapper(ctx, function);
	}

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(function->isPrototype && function->implementation)
			ctx.functions[function->functionIndex] = ctx.functions[function->implementation->functionIndex];
	}

	// Generate global variables
	for(unsigned i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		if(ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			LLVMValueRef value = LLVMAddGlobal(ctx.module, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

			if(!variable->importModule)
				LLVMSetInitializer(value, LLVMConstNull(CompileLlvmType(ctx, variable->type)));

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, value);
		}
	}

	for(unsigned i = 0; i < expression->definitions.size(); i++)
		CompileLlvm(ctx, expression->definitions[i]);

	ctx.skipFunctionDefinitions = true;

	// Generate global function
	{
		LLVMValueRef function = LLVMAddFunction(ctx.module, "__llvmEntry", LLVMFunctionType(LLVMVoidTypeInContext(ctx.context), NULL, 0, false));

		LLVMSetLinkage(function, LLVMExternalLinkage);

		// Setup global function
		ctx.currentFunction = function;
		ctx.currentFunctionGlobal = true;

		LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

		LLVMPositionBuilderAtEnd(ctx.builder, block);

		for(ExprBase *value = expression->setup.head; value; value = value->next)
			CompileLlvm(ctx, value);

		for(ExprBase *value = expression->expressions.head; value; value = value->next)
			CompileLlvm(ctx, value);

		LLVMBuildRetVoid(ctx.builder);

		CheckFunction(ctx, ctx.currentFunction, InplaceStr("global"));

		if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
			LLVMRunFunctionPassManager(ctx.functionPassManager, function);

		ctx.currentFunction = NULL;
		ctx.currentFunctionGlobal = false;
	}

	LLVMFinalizeFunctionPassManager(ctx.functionPassManager);

	char *error = NULL;

	if(LLVMVerifyModule(ctx.module, LLVMReturnStatusAction, &error))
	{
		printf("LLVM module verification failed with:\n%s\n", error);

		LLVMDisposeMessage(error);

		LLVMDisposePassManager(ctx.functionPassManager);

		LLVMDisposeBuilder(ctx.builder);

		LLVMDisposeModule(ctx.module);

		LLVMContextDispose(ctx.context);

		return NULL;
	}

	LLVMDisposeMessage(error);

	LlvmModule *module = new (ctx.get<LlvmModule>()) LlvmModule();

	LLVMMemoryBufferRef buffer = LLVMWriteBitcodeToMemoryBuffer(ctx.module);

	module->moduleSize = (unsigned)LLVMGetBufferSize(buffer);

	module->moduleData = (char*)ctx.allocator->alloc(module->moduleSize);

	if(const char *start = LLVMGetBufferStart(buffer))
		memcpy(module->moduleData, start, module->moduleSize);

	LLVMDisposeMemoryBuffer(buffer);

	LLVMDisposePassManager(ctx.functionPassManager);

	LLVMDisposeBuilder(ctx.builder);

	LLVMDisposeModule(ctx.module);

	LLVMContextDispose(ctx.context);

	return module;
}